

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

void masked_variance8xh(uint8_t *src_ptr,int src_stride,uint8_t *a_ptr,uint8_t *b_ptr,uint8_t *m_ptr
                       ,int m_stride,int height,uint *sse,int *sum_)

{
  int in_ESI;
  long in_RDI;
  __m128i *in_R8;
  int in_R9D;
  undefined1 auVar1 [16];
  __m128i m;
  __m128i b;
  __m128i a;
  __m128i src;
  __m128i sum_sq;
  __m128i sum;
  int y;
  int local_1a8;
  __m128i *local_1a0;
  long local_180;
  __m128i *in_stack_fffffffffffffee8;
  __m128i *in_stack_ffffffffffffff08;
  undefined4 local_c8;
  undefined4 local_a8;
  
  local_1a0 = in_R8;
  local_180 = in_RDI;
  for (local_1a8 = 0; local_1a8 < (int)m[1]; local_1a8 = local_1a8 + 2) {
    accumulate_block((__m128i *)(local_180 + in_ESI),in_stack_ffffffffffffff08,(__m128i *)0x0,
                     (__m128i *)(*(__m128i *)(local_180 + in_ESI))[0],local_1a0,
                     in_stack_fffffffffffffee8);
    local_180 = local_180 + (in_ESI << 1);
    local_1a0 = (__m128i *)((long)*local_1a0 + (long)(in_R9D << 1));
  }
  auVar1 = phaddd(ZEXT816(0),ZEXT816(0));
  auVar1 = phaddd(auVar1,auVar1);
  local_a8 = auVar1._0_4_;
  *(undefined4 *)b[1] = local_a8;
  local_c8 = auVar1._4_4_;
  *(undefined4 *)b[0] = local_c8;
  return;
}

Assistant:

static void masked_variance8xh(const uint8_t *src_ptr, int src_stride,
                               const uint8_t *a_ptr, const uint8_t *b_ptr,
                               const uint8_t *m_ptr, int m_stride, int height,
                               unsigned int *sse, int *sum_) {
  int y;
  __m128i sum = _mm_setzero_si128(), sum_sq = _mm_setzero_si128();

  for (y = 0; y < height; y += 2) {
    __m128i src = _mm_unpacklo_epi64(
        _mm_loadl_epi64((const __m128i *)src_ptr),
        _mm_loadl_epi64((const __m128i *)&src_ptr[src_stride]));
    const __m128i a = _mm_loadu_si128((const __m128i *)a_ptr);
    const __m128i b = _mm_loadu_si128((const __m128i *)b_ptr);
    const __m128i m =
        _mm_unpacklo_epi64(_mm_loadl_epi64((const __m128i *)m_ptr),
                           _mm_loadl_epi64((const __m128i *)&m_ptr[m_stride]));
    accumulate_block(&src, &a, &b, &m, &sum, &sum_sq);

    src_ptr += src_stride * 2;
    a_ptr += 16;
    b_ptr += 16;
    m_ptr += m_stride * 2;
  }
  // Reduce down to a single sum and sum of squares
  sum = _mm_hadd_epi32(sum, sum_sq);
  sum = _mm_hadd_epi32(sum, sum);
  *sum_ = _mm_cvtsi128_si32(sum);
  *sse = (unsigned int)_mm_cvtsi128_si32(_mm_srli_si128(sum, 4));
}